

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.cc
# Opt level: O1

void iqxmlrpc::http::validator::unsigned_number(string *val)

{
  byte bVar1;
  size_type sVar2;
  pointer pcVar3;
  ctype *pcVar4;
  Malformed_packet *this;
  size_t sVar5;
  size_type sVar6;
  bool bVar7;
  char errmsg [29];
  i_interpreter_type i_interpreter;
  string local_b8;
  string *local_98;
  uint local_8c;
  char local_88 [32];
  ushort local_68;
  locale local_60 [2];
  pointer local_50;
  pointer local_48;
  lexical_ostream_limited_src<char,_std::char_traits<char>_> local_40;
  
  builtin_strncpy(local_88 + 0x10,"meric option",0xd);
  builtin_strncpy(local_88,"bad format of nu",0x10);
  std::locale::locale((locale *)&local_b8);
  local_68 = 0x800;
  std::locale::locale(local_60,(locale *)&local_b8);
  sVar2 = val->_M_string_length;
  bVar7 = sVar2 == 0;
  local_98 = val;
  if (!bVar7) {
    pcVar3 = (val->_M_dataplus)._M_p;
    sVar6 = 0;
    bVar7 = false;
    do {
      bVar1 = pcVar3[sVar6];
      pcVar4 = std::use_facet<std::ctype<char>>(local_60);
      if ((local_68 & *(ushort *)(*(long *)(pcVar4 + 0x30) + (ulong)bVar1 * 2)) == 0) break;
      sVar6 = sVar6 + 1;
      bVar7 = sVar2 == sVar6;
    } while (!bVar7);
  }
  std::locale::~locale(local_60);
  std::locale::~locale((locale *)&local_b8);
  if (!bVar7) {
    this = (Malformed_packet *)__cxa_allocate_exception(0x18);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    sVar5 = strlen(local_88);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,local_88,local_88 + sVar5);
    Malformed_packet::Malformed_packet(this,&local_b8);
    __cxa_throw(this,&Malformed_packet::typeinfo,std::runtime_error::~runtime_error);
  }
  local_8c = 0;
  local_50 = (local_98->_M_dataplus)._M_p;
  local_48 = local_50 + local_98->_M_string_length;
  local_40.start = local_50;
  local_40.finish = local_48;
  bVar7 = boost::detail::lexical_ostream_limited_src<char,_std::char_traits<char>_>::
          shr_unsigned<unsigned_int>(&local_40,&local_8c);
  if (bVar7) {
    return;
  }
  local_b8._M_dataplus._M_p = (pointer)&PTR__bad_cast_0018a1e0;
  local_b8._M_string_length = (size_type)&std::__cxx11::string::typeinfo;
  local_b8.field_2._M_allocated_capacity = (size_type)&unsigned_int::typeinfo;
  boost::throw_exception<boost::bad_lexical_cast>((bad_lexical_cast *)&local_b8);
}

Assistant:

void unsigned_number(const std::string& val)
{
  const char errmsg[] = "bad format of numeric option";

  try {
    if (!boost::all(val, boost::is_digit()))
      throw Malformed_packet(errmsg);

    boost::lexical_cast<unsigned>(val);
  } catch (const boost::bad_lexical_cast&) {
    throw Malformed_packet(errmsg);
  }
}